

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_base.c
# Opt level: O1

MPP_RET hal_vp8e_setup(void *hal)

{
  MppBuffer *buffer;
  MppFrameFormat format;
  MppBufferGroup *group;
  bool bVar1;
  bool bVar2;
  undefined2 uVar3;
  RK_U32 RVar4;
  MPP_RET MVar5;
  MPP_RET MVar6;
  long lVar7;
  undefined1 *puVar8;
  void *pvVar9;
  undefined2 uVar10;
  int iVar11;
  uint uVar12;
  undefined2 uVar13;
  int iVar14;
  char *pcVar15;
  uint uVar16;
  undefined2 uVar17;
  undefined2 uVar18;
  undefined8 uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  ulong size;
  uint width;
  int *piVar24;
  VepuFormatCfg fmt_cfg;
  undefined4 local_58;
  VepuFormatCfg local_44;
  MppBuffer *local_38;
  
  lVar7 = *(long *)((long)hal + 0x70);
  uVar23 = *(uint *)(lVar7 + 0xc);
  uVar12 = *(uint *)(lVar7 + 0x10);
  if (*(int *)(lVar7 + 0x58) != 0) {
    _mpp_log_l(2,"hal_vp8e_base","Warning: do not support mirroring\n","set_parameter");
  }
  iVar11 = *(int *)(lVar7 + 0x50);
  if (iVar11 == 0) {
LAB_0026e887:
    local_58 = 0;
    bVar1 = true;
  }
  else {
    if (iVar11 == 1) {
      local_58 = 1;
    }
    else {
      if (iVar11 != 3) {
        _mpp_log_l(2,"hal_vp8e_base",
                   "Warning: only support 90 or 270 degree rotate, request rotate %d",
                   "set_parameter",0);
        goto LAB_0026e887;
      }
      local_58 = 2;
    }
    bVar1 = false;
  }
  uVar16 = uVar23 + 0xf & 0xfffffff0;
  uVar20 = uVar12 + 0xf & 0xfffffff0;
  width = uVar12;
  uVar21 = uVar20;
  if (bVar1) {
    width = uVar23;
    uVar21 = uVar16;
    uVar16 = uVar20;
    uVar23 = uVar12;
  }
  RVar4 = get_vepu_pixel_stride
                    ((VepuStrideCfg *)((long)hal + 0x6934),width,*(RK_U32 *)(lVar7 + 0x14),
                     *(MppFrameFormat *)(lVar7 + 0x24));
  iVar11 = (int)uVar21 >> 4;
  *(int *)((long)hal + 0x6928) = (int)(iVar11 * uVar16) >> 4;
  *(int *)((long)hal + 0x692c) = iVar11;
  iVar14 = (int)uVar16 >> 4;
  *(int *)((long)hal + 0x6930) = iVar14;
  *(uint *)((long)hal + 0x80) = uVar21;
  *(uint *)((long)hal + 0x84) = uVar16;
  *(int *)((long)hal + 0x78) = iVar11;
  *(int *)((long)hal + 0x7c) = iVar14;
  *(undefined1 (*) [16])((long)hal + 0x88) = (undefined1  [16])0x0;
  *(undefined4 *)((long)hal + 0x98) = 0;
  *(undefined8 *)((long)hal + 0x9c) = 0x100000003;
  *(undefined8 *)((long)hal + 0xa4) = 0;
  *(undefined4 *)((long)hal + 0xac) = 0;
  *(undefined8 *)((long)hal + 0xc4) = 0x100000001;
  *(undefined8 *)((long)hal + 0xb0) = 0x100000001;
  *(undefined4 *)((long)hal + 0x110) = 1;
  *(undefined4 *)((long)hal + 0xc0) = 0;
  *(undefined8 *)((long)hal + 0xb8) = 0;
  *(undefined1 *)((long)hal + 0xcc) = 1;
  *(undefined1 (*) [16])((long)hal + 0xf0) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)hal + 0xd0) = (undefined1  [16])0x0;
  *(undefined4 *)((long)hal + 400) = local_58;
  format = *(MppFrameFormat *)(lVar7 + 0x24);
  if ((format & ~MPP_FMT_YUV420P) == MPP_FMT_YUV420SP) {
    *(undefined4 *)((long)hal + 0x2f8) = 0;
LAB_0026e98f:
    *(undefined4 *)((long)hal + 0x2fc) = 0;
  }
  else {
    *(undefined4 *)((long)hal + 0x2f8) = 0;
    if (format - MPP_FMT_RGB565 < 6) goto LAB_0026e98f;
  }
  *(int *)((long)hal + 0x168) = iVar11;
  *(int *)((long)hal + 0x164) = iVar14;
  *(RK_U32 *)((long)hal + 0x178) = RVar4;
  uVar12 = 0x10 - (width & 0xf) >> 2;
  if ((width & 0xf) == 0) {
    uVar12 = 0;
  }
  *(uint *)((long)hal + 0x17c) = uVar12;
  iVar11 = 0x10 - (uVar23 & 0xf);
  if ((uVar23 & 0xf) == 0) {
    iVar11 = 0;
  }
  *(int *)((long)hal + 0x180) = iVar11;
  *(undefined4 *)((long)hal + 0x308) = 0;
  if (*(int *)(lVar7 + 0x28) == 1) {
    uVar3 = 0xa28f;
    uVar10 = 0x89f5;
    uVar13 = 0x2dc;
    uVar17 = 0xb717;
    uVar18 = 0x366d;
  }
  else {
    uVar3 = 0xb694;
    uVar10 = 0x9090;
    uVar13 = 0x1d50;
    uVar17 = 0x962b;
    uVar18 = 0x4c85;
  }
  *(undefined2 *)((long)hal + 900) = uVar18;
  *(undefined2 *)((long)hal + 0x386) = uVar17;
  *(undefined2 *)((long)hal + 0x388) = uVar13;
  *(undefined2 *)((long)hal + 0x38a) = uVar10;
  *(undefined2 *)((long)hal + 0x38c) = uVar3;
  *(undefined1 *)((long)hal + 0x390) = 0;
  *(undefined2 *)((long)hal + 0x38e) = 0;
  MVar5 = get_vepu_fmt(&local_44,format);
  if (MVar5 != MPP_OK) {
    _mpp_log_l(2,"hal_vp8e_base","set vp8e parameter failed",(char *)0x0);
    return MPP_NOK;
  }
  *(VepuFmt *)((long)hal + 0x18c) = local_44.format;
  *(RK_U8 *)((long)hal + 0x38e) = local_44.r_mask;
  *(RK_U8 *)((long)hal + 0x38f) = local_44.g_mask;
  *(RK_U8 *)((long)hal + 0x390) = local_44.b_mask;
  iVar11 = *(int *)((long)hal + 0x78);
  iVar14 = *(int *)((long)hal + 0x7c);
  memset((void *)((long)hal + 0x3660),0,0x188);
  lVar7 = 0x3674;
  do {
    *(int *)((long)hal + lVar7 + -0x14) = iVar11 << 4;
    *(int *)((long)hal + lVar7 + -0x10) = iVar14 << 4;
    *(int *)((long)hal + lVar7 + -0xc) = iVar11 << 3;
    *(int *)((long)hal + lVar7 + -8) = iVar14 << 3;
    *(undefined8 *)((long)hal + lVar7 + -4) = 0;
    lVar7 = lVar7 + 0x38;
  } while (lVar7 != 0x3754);
  *(void **)((long)hal + 0x37e8) = (void *)((long)hal + 0x3660);
  *(undefined4 *)((long)hal + 0x120) = 1;
  puVar8 = (undefined1 *)mpp_osal_calloc("set_picbuf",0x3c);
  *(undefined1 **)((long)hal + 0x118) = puVar8;
  if (puVar8 == (undefined1 *)0x0) {
    _mpp_log_l(2,"hal_vp8e_base","failed to malloc ppss store.\n",(char *)0x0);
    _mpp_log_l(2,"hal_vp8e_base","set vp8e picbuf failed, no enough memory",(char *)0x0);
    return MPP_ERR_NOMEM;
  }
  *(undefined1 **)((long)hal + 0x128) = puVar8;
  puVar8[0x18] = 0;
  *puVar8 = 0;
  group = *(MppBufferGroup **)((long)hal + 0x60);
  lVar7 = *(long *)((long)hal + 0x70);
  uVar23 = *(uint *)((long)hal + 0x6928);
  *(undefined4 *)((long)hal + 0x174) = 1;
  MVar5 = mpp_buffer_group_get
                    (group,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_vp8e_base","alloc_buffer");
  if (MVar5 == MPP_OK) {
    MVar5 = mpp_buffer_get_with_tag
                      (*group,group + 3,(ulong)((uVar23 * 0x100 + 0xfff & 0xfffff000) + 0x1000),
                       "hal_vp8e_base","alloc_buffer");
    if (MVar5 == MPP_OK) {
      size = (ulong)((uVar23 * 0x80 + 0xfff & 0xfffff000) + 0x1000);
      local_38 = group + 3;
      MVar5 = mpp_buffer_get_with_tag(*group,group + 4,size,"hal_vp8e_base","alloc_buffer");
      if (MVar5 == MPP_OK) {
        MVar5 = MPP_OK;
        bVar1 = false;
        do {
          bVar2 = bVar1;
          if (bVar2) goto LAB_0026ed32;
          MVar6 = mpp_buffer_get_with_tag(*group,group + 5,size,"hal_vp8e_base","alloc_buffer");
          bVar1 = true;
        } while (MVar6 == MPP_OK);
        uVar19 = 1;
        MVar5 = MVar6;
      }
      else {
        uVar19 = 0;
        bVar2 = false;
      }
      _mpp_log_l(2,"hal_vp8e_base","hw_cbcr_buf[%d] get failed ret %d\n",(char *)0x0,uVar19,
                 (ulong)(uint)MVar5);
LAB_0026ed32:
      if (!bVar2) goto LAB_0026ec62;
      iVar11 = mpp_buffer_get_fd_with_caller(group[3],"alloc_buffer");
      *(int *)((long)hal + 0x1bc) = iVar11;
      iVar11 = mpp_buffer_get_fd_with_caller(group[4],"alloc_buffer");
      *(int *)((long)hal + 0x1c0) = iVar11;
      iVar11 = mpp_buffer_get_fd_with_caller(group[3],"alloc_buffer");
      *(int *)((long)hal + 0x1c4) = iVar11;
      iVar11 = mpp_buffer_get_fd_with_caller(group[5],"alloc_buffer");
      *(int *)((long)hal + 0x1cc) = iVar11;
      MVar5 = mpp_buffer_get_with_tag
                        (*group,group + 7,(ulong)(*(int *)(lVar7 + 0x10) * 4 + 0x17U & 0xfffffff8),
                         "hal_vp8e_base","alloc_buffer");
      if (MVar5 == MPP_OK) {
        MVar5 = mpp_buffer_get_with_tag(*group,group + 6,0x4b8,"hal_vp8e_base","alloc_buffer");
        if (MVar5 != MPP_OK) {
          pcVar15 = "hw_cabac_table_buf get failed\n";
LAB_0026ee08:
          _mpp_log_l(2,"hal_vp8e_base",pcVar15,(char *)0x0);
          goto LAB_0026ec62;
        }
        iVar11 = mpp_buffer_get_fd_with_caller(group[6],"alloc_buffer");
        *(int *)((long)hal + 0x378) = iVar11;
        MVar5 = mpp_buffer_get_with_tag
                          (*group,group + 10,(ulong)(uVar23 * 4),"hal_vp8e_base","alloc_buffer");
        if (MVar5 == MPP_OK) {
          iVar11 = mpp_buffer_get_fd_with_caller(group[10],"alloc_buffer");
          *(int *)((long)hal + 0x374) = iVar11;
          pvVar9 = mpp_buffer_get_ptr_with_caller(group[10],"alloc_buffer");
          memset(pvVar9,0,(ulong)uVar23 << 2);
          mpp_buffer_sync_end_f(group[10],0,"alloc_buffer");
          MVar5 = mpp_buffer_get_with_tag(*group,group + 9,0x1e8,"hal_vp8e_base","alloc_buffer");
          if (MVar5 == MPP_OK) {
            iVar11 = mpp_buffer_get_fd_with_caller(group[9],"alloc_buffer");
            *(int *)((long)hal + 0x37c) = iVar11;
            uVar23 = uVar23 * 4 + 0x3f >> 3 & 0xfffffff8;
            buffer = group + 8;
            MVar5 = mpp_buffer_get_with_tag
                              (*group,buffer,(ulong)uVar23,"hal_vp8e_base","alloc_buffer");
            if (MVar5 != MPP_OK) {
              _mpp_log_l(2,"hal_vp8e_base","hw_segment_map_buf get failed ret %d\n",(char *)0x0,
                         (ulong)(uint)MVar5);
              goto LAB_0026ec62;
            }
            iVar11 = mpp_buffer_get_fd_with_caller(*buffer,"alloc_buffer");
            *(int *)((long)hal + 0x380) = iVar11;
            pvVar9 = mpp_buffer_get_ptr_with_caller(*buffer,"alloc_buffer");
            memset(pvVar9,0,(ulong)(uVar23 >> 2));
            mpp_buffer_sync_end_f(*buffer,0,"alloc_buffer");
            *(undefined4 *)((long)hal + 0x3640) = 1;
            iVar11 = mpp_buffer_get_fd_with_caller(*local_38,"alloc_buffer");
            *(int *)((long)hal + 0x3670) = iVar11;
            piVar24 = (int *)((long)hal + 0x3674);
            lVar22 = 4;
            do {
              iVar11 = mpp_buffer_get_fd_with_caller(group[lVar22],"alloc_buffer");
              *piVar24 = iVar11;
              lVar22 = lVar22 + 1;
              piVar24 = piVar24 + 0xe;
            } while (lVar22 == 5);
            iVar11 = (*(int *)(lVar7 + 0x10) + 0xfU & 0xffffff0) *
                     (*(int *)(lVar7 + 0xc) + 0xfU & 0xfffffff0);
            MVar5 = mpp_buffer_get_with_tag
                              (*group,group + 0xb,(ulong)((uint)((iVar11 >> 1) + iVar11) >> 1),
                               "hal_vp8e_base","alloc_buffer");
            if (MVar5 == MPP_OK) {
              pvVar9 = mpp_osal_calloc("alloc_buffer",(ulong)*(uint *)((long)hal + 0x68) << 2);
              *(void **)((long)hal + 0x58) = pvVar9;
              if (pvVar9 != (void *)0x0) {
                *(undefined8 *)((long)hal + 0x324) = 0xffffffffffffffff;
                *(undefined4 *)((long)hal + 0x32c) = 0xffffffff;
                *(undefined4 *)((long)hal + 0x310) = 0xffffffff;
                *(undefined4 *)((long)hal + 0x314) = 0xffffffff;
                *(undefined4 *)((long)hal + 0x318) = 0xffffffff;
                *(undefined4 *)((long)hal + 0x31c) = 0xffffffff;
                *(undefined8 *)((long)hal + 0x4f4) = 0;
                *(undefined8 *)((long)hal + 0x4fc) = 0x3ff;
                *(undefined4 *)((long)hal + 0x4ec) = 0;
                *(undefined8 *)((long)hal + 0x344) = 0xff000000ff;
                *(undefined8 *)((long)hal + 0x33c) = 0xff000000ff;
                *(undefined4 *)((long)hal + 0x354) = 0xff;
                *(undefined8 *)((long)hal + 0x34c) = 0xff000000ff;
                *(undefined8 *)((long)hal + 0x358) = 0xff000000ff;
                *(undefined8 *)((long)hal + 0x364) = 0xff000000ff;
                *(undefined4 *)((long)hal + 0x360) = 0xff;
                return MPP_OK;
              }
              pcVar15 = "failed to calloc regs.\n";
              goto LAB_0026ee08;
            }
            pcVar15 = "hw_out_buf get failed ret %d\n";
          }
          else {
            pcVar15 = "hw_prob_count_buf get failed ret %d\n";
          }
        }
        else {
          pcVar15 = "hw_mv_output_buf get failed ret %d\n";
        }
      }
      else {
        pcVar15 = "hw_size_table_buf get failed ret %d\n";
      }
    }
    else {
      pcVar15 = "hw_luma_buf get failed ret %d\n";
    }
  }
  else {
    pcVar15 = "buf group get failed ret %d\n";
  }
  _mpp_log_l(2,"hal_vp8e_base",pcVar15,(char *)0x0,(ulong)(uint)MVar5);
LAB_0026ec62:
  if (group != (MppBufferGroup *)0x0) {
    hal_vp8e_buf_free(hal);
  }
  return MVar5;
}

Assistant:

MPP_RET hal_vp8e_setup(void *hal)
{
    MPP_RET ret = MPP_OK;
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;

    if (set_parameter(ctx)) {
        mpp_err("set vp8e parameter failed");
        return MPP_NOK;
    }

    if (set_picbuf(ctx)) {
        mpp_err("set vp8e picbuf failed, no enough memory");
        return MPP_ERR_NOMEM;
    }

    ret = alloc_buffer(ctx);

    return ret;
}